

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageInsertCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  Fts5Index *p;
  int iVar1;
  Fts5Index *pIdx;
  Fts5InsertCtx *pCtx;
  int iUnused2_local;
  int iUnused1_local;
  int nToken_local;
  char *pToken_local;
  int tflags_local;
  void *pContext_local;
  
  p = *(Fts5Index **)(*pContext + 8);
  iUnused2_local = nToken;
  if (0x8000 < nToken) {
    iUnused2_local = 0x8000;
  }
  if (((tflags & 1U) == 0) || (*(int *)((long)pContext + 0xc) == 0)) {
    *(int *)((long)pContext + 0xc) = *(int *)((long)pContext + 0xc) + 1;
  }
  iVar1 = sqlite3Fts5IndexWrite
                    (p,*(int *)((long)pContext + 8),*(int *)((long)pContext + 0xc) + -1,pToken,
                     iUnused2_local);
  return iVar1;
}

Assistant:

static int fts5StorageInsertCallback(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5InsertCtx *pCtx = (Fts5InsertCtx*)pContext;
  Fts5Index *pIdx = pCtx->pStorage->pIndex;
  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }
  return sqlite3Fts5IndexWrite(pIdx, pCtx->iCol, pCtx->szCol-1, pToken, nToken);
}